

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O3

void __thiscall cursespp::AppLayout::Initialize(AppLayout *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  ShortcutsWindow *__tmp;
  undefined1 local_39;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  std::__shared_ptr<cursespp::ShortcutsWindow,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cursespp::ShortcutsWindow>>
            ((__shared_ptr<cursespp::ShortcutsWindow,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (allocator<cursespp::ShortcutsWindow> *)&local_39);
  local_30 = p_Stack_20;
  peVar1 = local_28;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  this_00 = (this->shortcuts).
            super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_30;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
    local_30 = (this->shortcuts).
               super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  }
  local_38 = (this->shortcuts).
             super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x46])
            (this,&local_38);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

void AppLayout::Initialize() {
    this->shortcuts = std::make_shared<ShortcutsWindow>();
    this->AddWindow(this->shortcuts);

#if ENABLE_DEMO_MODE
    this->hotkey.reset(new TextLabel());
    this->hotkey->SetContentColor(Color::Footer);
    this->hotkey->SetText("keypress: <none>", text::AlignCenter);
    this->AddWindow(this->hotkey);
#endif
}